

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O1

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
PlainObjectBase<Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::MatrixWrapper<Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::member_sum<double>,0>const>,0>>const>const>>
          (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          DenseBase<Eigen::MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::member_sum<double>,_0>_>,_0>_>_>_>_>
          *other)

{
  ulong rows;
  ulong cols;
  undefined1 auVar1 [16];
  undefined8 *puVar2;
  undefined8 uVar3;
  ActualDstType actualDst;
  bool bVar4;
  assign_op<double,_double> local_11;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  rows = *(ulong *)(other + 0x18);
  cols = *(ulong *)(*(long *)(other + 0x38) + 0x10);
  bVar4 = cols == 0 || rows == 0;
  if ((bVar4) ||
     (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     uVar3 = SUB168(auVar1 % SEXT816((long)cols),0),
     (long)rows <= SUB168(auVar1 / SEXT816((long)cols),0))) {
    if ((long)(cols | rows) < 0) {
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/m-iDev-0792[P]HJNN/include/Eigen/src/Core/PlainObjectBase.h"
                    ,0x11d,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((bVar4) ||
       (auVar1 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       uVar3 = SUB168(auVar1 % SEXT816((long)cols),0),
       (long)rows <= SUB168(auVar1 / SEXT816((long)cols),0))) {
      DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)this,cols * rows,rows,cols);
      internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::MatrixWrapper<Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::member_sum<double>,0>const>,0>>const>const>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)this,
                 (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::MatrixWrapper<const_Eigen::PartialReduxExpr<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::member_sum<double>,_0>_>,_0>_>_>_>
                  *)other,&local_11);
      return;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8,bVar4,uVar3);
  *puVar2 = std::random_device::_M_fini;
  __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }